

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EquivalentTypeSet.cpp
# Opt level: O2

bool Js::EquivalentTypeSet::IsSubsetOf(EquivalentTypeSet *left,EquivalentTypeSet *right)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ushort uVar8;
  long lVar9;
  bool bVar10;
  
  if (left->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(left);
  }
  if (right->sortedAndDuplicatesRemoved == false) {
    SortAndRemoveDuplicates(right);
  }
  uVar8 = right->count;
  uVar6 = 0;
  bVar10 = false;
  if (left->count <= uVar8) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    uVar4 = 0;
    do {
      bVar10 = left->count <= uVar4;
      if (bVar10) {
        return true;
      }
      lVar5 = (long)(int)uVar6;
      lVar9 = lVar5 * 8;
      for (; uVar7 = (ulong)uVar8, lVar5 < (long)uVar7; lVar5 = lVar5 + 1) {
        bVar2 = JITTypeHolderBase<Memory::Recycler>::operator<
                          ((left->types).ptr + uVar4,
                           (JITTypeHolderBase<Memory::Recycler> *)
                           ((long)&(((right->types).ptr)->t).ptr + lVar9));
        if (bVar2) {
          return false;
        }
        bVar2 = JITTypeHolderBase<Memory::Recycler>::operator==
                          ((left->types).ptr + uVar4,
                           (JITTypeHolderBase<Memory::Recycler> *)
                           ((long)&(((right->types).ptr)->t).ptr + lVar9));
        if (bVar2) {
          uVar6 = uVar6 + 1;
          uVar8 = right->count;
          break;
        }
        uVar8 = right->count;
        uVar6 = uVar6 + 1;
        lVar9 = lVar9 + 8;
      }
      if ((int)(uint)uVar8 < (int)uVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EquivalentTypeSet.cpp"
                                    ,0x77,"(j <= right->count)","j <= right->count");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        uVar8 = right->count;
      }
      uVar4 = uVar4 + 1;
    } while ((lVar5 < (long)uVar7) || (uVar6 != uVar8));
  }
  return bVar10;
}

Assistant:

bool EquivalentTypeSet::IsSubsetOf(EquivalentTypeSet * left, EquivalentTypeSet * right)
{
    if (!left->GetSortedAndDuplicatesRemoved())
    {
        left->SortAndRemoveDuplicates();
    }
    if (!right->GetSortedAndDuplicatesRemoved())
    {
        right->SortAndRemoveDuplicates();
    }

    if (left->count > right->count)
    {
        return false;
    }

    // Try to find each left type in the right set.
    int j = 0;
    for (int i = 0; i < left->count; i++)
    {
        bool found = false;
        for (; j < right->count; j++)
        {
            if (left->types[i] < right->types[j])
            {
                // Didn't find the left type. Fail.
                return false;
            }
            if (left->types[i] == right->types[j])
            {
                // Found the left type. Continue to the next left/right pair.
                found = true;
                j++;
                break;
            }
        }
        Assert(j <= right->count);
        if (j == right->count && !found)
        {
            // Exhausted the right set without finding the current left type.
            return false;
        }
    }
    return true;
}